

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueUintCase::test(UniformValueUintCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestContext *pTVar2;
  bool bVar3;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint GVar4;
  int iVar5;
  undefined7 extraout_var;
  undefined1 auVar6 [16];
  StateQueryMemoryWriteGuard<unsigned_int[1]> state;
  undefined1 local_1e8 [12];
  uint uStack_1dc;
  uint local_1d8 [2];
  DataType aDStack_1d0 [2];
  uint local_1c8 [4];
  GLuint local_1b8;
  GLuint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  local_1b4 = shader;
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  local_1b8 = shader_00;
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"uintUniform");
  glu::CallLogWrapper::glUniform1ui(this_00,GVar4,1);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_1e8._0_4_ = 0xdededede;
  local_1e8._4_4_ = 0xdededede;
  local_1e8._8_4_ = 0xdededede;
  glu::CallLogWrapper::glGetUniformuiv(this_00,program,GVar4,(GLuint *)(local_1e8 + 4));
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[1]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_int[1]> *)local_1e8,pTVar2);
  if ((bVar3) && (local_1e8._4_4_ != 1)) {
    local_1b0._0_8_ = pTVar2->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: expected [",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]; got [",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"uint2Uniform");
  glu::CallLogWrapper::glUniform2ui(this_00,GVar4,1,2);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_1d8[0] = 0xdededede;
  local_1d8[1] = 0xdededede;
  local_1e8._0_4_ = 0xdededede;
  local_1e8._4_4_ = 0xdededede;
  local_1e8._8_4_ = 0xdededede;
  uStack_1dc = 0xdededede;
  glu::CallLogWrapper::glGetUniformuiv(this_00,program,GVar4,(GLuint *)(local_1e8 + 8));
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_int[2]> *)local_1e8,pTVar2);
  if ((bVar3) && ((local_1e8._8_4_ != 1 || (uStack_1dc != 2)))) {
    local_1b0._0_8_ = pTVar2->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: expected [",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]; got [",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"uint3Uniform");
  glu::CallLogWrapper::glUniform3ui(this_00,GVar4,1,2,3);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_1d8[0] = 0xdededede;
  local_1d8[1] = 0xdededede;
  aDStack_1d0[0] = 0xdededede;
  aDStack_1d0[1] = 0xdededede;
  local_1e8._0_4_ = 0xdededede;
  local_1e8._4_4_ = 0xdededede;
  local_1e8._8_4_ = 0xdededede;
  uStack_1dc = 0xdededede;
  local_1c8[0] = 0xdededede;
  glu::CallLogWrapper::glGetUniformuiv(this_00,program,GVar4,&uStack_1dc);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_int[3]> *)local_1e8,pTVar2);
  if ((bVar3) && (((uStack_1dc != 1 || (local_1d8[0] != 2)) || (local_1d8[1] != 3)))) {
    local_1b0._0_8_ = pTVar2->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: expected [",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]; got [",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"uint4Uniform");
  glu::CallLogWrapper::glUniform4ui(this_00,GVar4,1,2,3,4);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_1c8[0] = 0xdededede;
  local_1c8[1] = 0xdededede;
  local_1c8[2] = 0xdededede;
  local_1c8[3] = 0xdededede;
  local_1d8[0] = 0xdededede;
  local_1d8[1] = 0xdededede;
  aDStack_1d0[0] = 0xdededede;
  aDStack_1d0[1] = 0xdededede;
  local_1e8._0_4_ = 0xdededede;
  local_1e8._4_4_ = 0xdededede;
  local_1e8._8_4_ = 0xdededede;
  uStack_1dc = 0xdededede;
  glu::CallLogWrapper::glGetUniformuiv(this_00,program,GVar4,local_1d8);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)local_1e8,pTVar2);
  if ((bVar3) &&
     (auVar6._0_4_ = -(uint)(local_1d8[0] == TYPE_FLOAT),
     auVar6._4_4_ = -(uint)(local_1d8[1] == TYPE_FLOAT_VEC2),
     auVar6._8_4_ = -(uint)(aDStack_1d0[0] == TYPE_FLOAT_VEC3),
     auVar6._12_4_ = -(uint)(aDStack_1d0[1] == TYPE_FLOAT_VEC4),
     iVar5 = movmskps((int)CONCAT71(extraout_var,bVar3),auVar6), iVar5 != 0xf)) {
    local_1b0._0_8_ = pTVar2->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: expected [",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]; got [",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteShader(this_00,local_1b4);
  glu::CallLogWrapper::glDeleteShader(this_00,local_1b8);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp uint uintUniform;\n"
			"uniform highp uvec2 uint2Uniform;\n"
			"uniform highp uvec3 uint3Uniform;\n"
			"uniform highp uvec4 uint4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(uintUniform + uint2Uniform.x + uint3Uniform.x + uint4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program,"uintUniform");
		glUniform1ui(location, 1);
		verifyUniformValue1ui(m_testCtx, *this, program, location, 1);

		location = glGetUniformLocation(program,"uint2Uniform");
		glUniform2ui(location, 1, 2);
		verifyUniformValue2ui(m_testCtx, *this, program, location, 1, 2);

		location = glGetUniformLocation(program,"uint3Uniform");
		glUniform3ui(location, 1, 2, 3);
		verifyUniformValue3ui(m_testCtx, *this, program, location, 1, 2, 3);

		location = glGetUniformLocation(program,"uint4Uniform");
		glUniform4ui(location, 1, 2, 3, 4);
		verifyUniformValue4ui(m_testCtx, *this, program, location, 1, 2, 3, 4);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}